

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerStElemC(Lowerer *this,Instr *stElem)

{
  Instr *pIVar1;
  Instr *insertBeforeInstr;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  ObjectType OVar6;
  int iVar7;
  Opnd *pOVar8;
  IndirOpnd *this_00;
  RegOpnd *pRVar9;
  undefined4 *puVar10;
  RegOpnd *pRVar11;
  JitProfilingInstr *pJVar12;
  HelperCallOpnd *newSrc;
  LabelInstr *target;
  IntConstOpnd *pIVar13;
  Opnd *pOVar14;
  long value_00;
  JnHelperMethod fnHelper;
  uint uVar15;
  byte local_131;
  IntConstType offset;
  BYTE indirScale;
  Opnd *missingElementOpnd;
  RegOpnd *typeIdOpnd;
  Instr *instrInsertBranch;
  JnHelperMethod helperMethod;
  IntConstOpnd *intConstIndexOpnd;
  LabelInstr *labelDone;
  Instr *instrBailOut;
  LabelInstr *labelBailOut;
  RegOpnd *pRStack_58;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  IntConstType base;
  long lStack_40;
  JnHelperMethod meth;
  IntConstType value;
  RegOpnd *indexOpnd;
  IndirOpnd *indirOpnd;
  Instr *instrPrev;
  Instr *stElem_local;
  Lowerer *this_local;
  
  pIVar1 = stElem->m_prev;
  pOVar8 = IR::Instr::GetDst(stElem);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar8);
  pRVar9 = IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if ((pRVar9 != (RegOpnd *)0x0) && (bVar3 = StackSym::IsIntConst(pRVar9->m_sym), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2bc6,"(!indexOpnd || indexOpnd->m_sym->IsIntConst())",
                       "!indexOpnd || indexOpnd->m_sym->IsIntConst()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (pRVar9 == (RegOpnd *)0x0) {
    iVar7 = IR::IndirOpnd::GetOffset(this_00);
  }
  else {
    pRVar11 = IR::Opnd::AsRegOpnd(&pRVar9->super_Opnd);
    iVar7 = StackSym::GetIntConstValue(pRVar11->m_sym);
    IR::Opnd::Free(&pRVar9->super_Opnd,this->m_func);
  }
  lStack_40 = (long)iVar7;
  bVar3 = IR::Instr::IsJitProfilingInstr(stElem);
  if (bVar3) {
    pJVar12 = IR::Instr::AsJitProfilingInstr(stElem);
    if (pJVar12->profileId != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bd5,
                         "(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId)",
                         "stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pOVar8 = IR::Instr::UnlinkSrc1(stElem);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stElem,pOVar8);
    fnHelper = HelperSimpleStoreArraySegHelper;
    if (stElem->m_opcode == StElemC) {
      fnHelper = HelperSimpleStoreArrayHelper;
    }
    newSrc = IR::HelperCallOpnd::New(fnHelper,this->m_func);
    IR::Instr::SetSrc1(stElem,&newSrc->super_Opnd);
    pIVar13 = IR::IntConstOpnd::New(lStack_40,TyUint32,this->m_func,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stElem,&pIVar13->super_Opnd);
    pRVar9 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stElem,&pRVar9->super_Opnd);
    pOVar8 = IR::Instr::UnlinkDst(stElem);
    IR::Opnd::Free(pOVar8,this->m_func);
    LowererMD::LowerCall(&this->m_lowererMD,stElem,0);
  }
  else {
    pRStack_58 = IR::IndirOpnd::GetBaseOpnd(this_00);
    labelBailOut._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRStack_58->super_Opnd);
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)&labelBailOut + 6));
    instrPrev = stElem;
    if (bVar3) {
      if (stElem->m_opcode != StElemC) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2bea,"(stElem->m_opcode == Js::OpCode::StElemC)",
                           "stElem->m_opcode == Js::OpCode::StElemC");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      instrBailOut = (Instr *)0x0;
      bVar3 = IR::Instr::HasBailOutInfo(stElem);
      if (bVar3) {
        instrBailOut = &IR::LabelInstr::New(Label,this->m_func,true)->super_Instr;
        instrPrev = IR::Instr::New(stElem->m_opcode,this->m_func);
        IR::Instr::TransferTo(stElem,instrPrev);
        IR::Instr::InsertBefore(stElem,instrPrev);
        target = IR::LabelInstr::New(Label,this->m_func,false);
        InsertBranch(Br,target,stElem);
        IR::Instr::InsertBefore(stElem,instrBailOut);
        IR::Instr::InsertAfter(stElem,&target->super_Instr);
        stElem->m_opcode = BailOut;
        GenerateBailOut(this,stElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      }
      bVar3 = ValueType::IsObject((ValueType *)((long)&labelBailOut + 6));
      if (!bVar3) {
        if (instrBailOut == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c04,"(labelBailOut)","labelBailOut");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        GenerateArrayTest(this,pRStack_58,(LabelInstr *)instrBailOut,(LabelInstr *)instrBailOut,
                          instrPrev,true,false,false);
      }
      pOVar8 = IR::Instr::GetSrc1(instrPrev);
      IVar5 = IR::Opnd::GetType(pOVar8);
      if (IVar5 == TyVar) {
        if (instrBailOut == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c0f,"(labelBailOut)","labelBailOut");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        LoadScriptContext(this,instrPrev);
        pOVar8 = IR::Instr::UnlinkSrc1(instrPrev);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,instrPrev,pOVar8);
        pIVar13 = IR::IntConstOpnd::New(lStack_40,TyUint32,this->m_func,false);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,instrPrev,&pIVar13->super_Opnd);
        pRVar9 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,instrPrev,&pRVar9->super_Opnd);
        bVar3 = ValueType::HasIntElements((ValueType *)((long)&labelBailOut + 6));
        if (bVar3) {
          instrInsertBranch._4_4_ = HelperScrArr_SetNativeIntElementC;
        }
        else {
          instrInsertBranch._4_4_ = HelperScrArr_SetNativeFloatElementC;
        }
        insertBeforeInstr = instrPrev->m_next;
        pRVar9 = IR::RegOpnd::New(TyUint32,this->m_func);
        IR::Instr::ReplaceDst(instrPrev,&pRVar9->super_Opnd);
        LowererMD::ChangeToHelperCall
                  (&this->m_lowererMD,instrPrev,instrInsertBranch._4_4_,(LabelInstr *)0x0,
                   (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
        bVar3 = ValueType::HasIntElements((ValueType *)((long)&labelBailOut + 6));
        uVar15 = 0x20;
        if (bVar3) {
          uVar15 = 0x1e;
        }
        pIVar13 = IR::IntConstOpnd::New((ulong)uVar15,TyUint32,this->m_func,false);
        InsertCompareBranch(this,&pRVar9->super_Opnd,&pIVar13->super_Opnd,BrNeq_A,
                            (LabelInstr *)instrBailOut,insertBeforeInstr,false);
        return pIVar1;
      }
      bVar3 = ValueType::HasIntElements((ValueType *)((long)&labelBailOut + 6));
      if ((bVar3) && (instrBailOut != (Instr *)0x0)) {
        pOVar8 = IR::Instr::GetSrc1(instrPrev);
        IVar5 = IR::Opnd::GetType(pOVar8);
        IVar4 = GetArrayIndirType((ValueType)labelBailOut._6_2_);
        if (IVar5 != IVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c38,
                             "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                             "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pOVar8 = IR::Instr::GetSrc1(instrPrev);
        IVar5 = IR::Opnd::GetType(pOVar8);
        pOVar8 = GetMissingItemOpnd(IVar5,this->m_func);
        pOVar14 = IR::Instr::GetSrc1(instrPrev);
        bVar3 = IR::Opnd::IsEqual(pOVar14,pOVar8);
        if (bVar3) {
          InsertBranch(Br,(LabelInstr *)instrBailOut,instrPrev);
          *(byte *)&instrBailOut[1].m_func = *(byte *)&instrBailOut[1].m_func & 0xdf | 0x20;
          IR::Instr::Remove(instrPrev);
          return pIVar1;
        }
        pOVar8 = IR::Instr::GetSrc1(instrPrev);
        InsertMissingItemCompareBranch(this,pOVar8,BrEq_A,(LabelInstr *)instrBailOut,instrPrev);
      }
      else {
        pOVar8 = IR::Instr::GetSrc1(instrPrev);
        IVar5 = IR::Opnd::GetType(pOVar8);
        IVar4 = GetArrayIndirType((ValueType)labelBailOut._6_2_);
        if (IVar5 != IVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c4c,
                             "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                             "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
      }
      pOVar8 = IR::Instr::GetDst(instrPrev);
      pOVar14 = IR::Instr::GetSrc1(instrPrev);
      IVar5 = IR::Opnd::GetType(pOVar14);
      IR::Opnd::SetType(pOVar8,IVar5);
      if (0x40 < lStack_40) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c4f,"(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)",
                           "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      ValueType::HasIntElements((ValueType *)((long)&labelBailOut + 6));
      baseOpnd = (RegOpnd *)0x58;
    }
    else {
      bVar3 = ValueType::IsLikelyObject((ValueType *)((long)&labelBailOut + 6));
      if ((bVar3) &&
         (OVar6 = ValueType::GetObjectType((ValueType *)((long)&labelBailOut + 6)), OVar6 == Array))
      {
        if (stElem->m_opcode != StElemC) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c5c,"(stElem->m_opcode == Js::OpCode::StElemC)",
                             "stElem->m_opcode == Js::OpCode::StElemC");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        if (0x40 < lStack_40) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c5d,"(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)",
                             "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        baseOpnd = (RegOpnd *)0x50;
      }
      else {
        if ((stElem->m_opcode != StElemC) && (stElem->m_opcode != StArrSegElemC)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c62,
                             "(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC)"
                             ,
                             "stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pRVar9 = IR::IndirOpnd::GetBaseOpnd(this_00);
        IVar5 = IR::Opnd::GetType(&pRVar9->super_Opnd);
        if (IVar5 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2c63,"(indirOpnd->GetBaseOpnd()->GetType() == TyVar)",
                             "indirOpnd->GetBaseOpnd()->GetType() == TyVar");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        baseOpnd = (RegOpnd *)0x18;
      }
    }
    if (lStack_40 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c66,"(value >= 0)","value >= 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&labelBailOut + 6));
    if (bVar3) {
      local_131 = GetArrayIndirScale((ValueType)labelBailOut._6_2_);
    }
    else {
      local_131 = LowererMD::GetDefaultIndirScale();
    }
    value_00 = (long)&(baseOpnd->super_Opnd)._vptr_Opnd + (lStack_40 << (local_131 & 0x3f));
    bVar3 = Math::FitsInDWord(value_00);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c6c,"(Math::FitsInDWord(offset))","Math::FitsInDWord(offset)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    IR::IndirOpnd::SetOffset(this_00,(int32)value_00,false);
    LowererMD::ChangeToWriteBarrierAssign(instrPrev,this->m_func);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerStElemC(IR::Instr * stElem)
{
    IR::Instr *instrPrev = stElem->m_prev;
    IR::IndirOpnd * indirOpnd = stElem->GetDst()->AsIndirOpnd();
    IR::RegOpnd *indexOpnd = indirOpnd->UnlinkIndexOpnd();

    Assert(!indexOpnd || indexOpnd->m_sym->IsIntConst());

    IntConstType value;
    if (indexOpnd)
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        indexOpnd->Free(this->m_func);
    }
    else
    {
        value = (IntConstType)indirOpnd->GetOffset();
    }

    if (stElem->IsJitProfilingInstr())
    {
        Assert(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId);
        m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

        const auto meth = stElem->m_opcode == Js::OpCode::StElemC ? IR::HelperSimpleStoreArrayHelper : IR::HelperSimpleStoreArraySegHelper;

        stElem->SetSrc1(IR::HelperCallOpnd::New(meth, m_func));

        m_lowererMD.LoadHelperArgument(stElem, IR::IntConstOpnd::New(value, TyUint32, m_func));
        m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

        stElem->UnlinkDst()->Free(m_func);

        m_lowererMD.LowerCall(stElem, 0);
        return instrPrev;
    }

    IntConstType base;
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsLikelyNativeArray())
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);

        IR::LabelInstr *labelBailOut = nullptr;
        IR::Instr *instrBailOut = nullptr;

        if (stElem->HasBailOutInfo())
        {
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
            instrBailOut = stElem;
            stElem = IR::Instr::New(instrBailOut->m_opcode, m_func);
            instrBailOut->TransferTo(stElem);
            instrBailOut->InsertBefore(stElem);

            IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertBranch(Js::OpCode::Br, labelDone, instrBailOut);

            instrBailOut->InsertBefore(labelBailOut);
            instrBailOut->InsertAfter(labelDone);

            instrBailOut->m_opcode = Js::OpCode::BailOut;
            GenerateBailOut(instrBailOut);
        }

        if (!baseValueType.IsObject())
        {
            // Likely native array: do a vtable check and bail if it fails.
            Assert(labelBailOut);
            GenerateArrayTest(baseOpnd, labelBailOut, labelBailOut, stElem, true);
        }

        if (stElem->GetSrc1()->GetType() == TyVar)
        {
            // Storing a non-specialized value. This may cause array conversion, which invalidates all the code
            // that depends on the array check we've already done.
            // Call a helper that returns the type ID of the resulting array, check it here against the one we
            // expect, and bail if it fails.

            Assert(labelBailOut);

            // Call a helper to (try and) unbox the var and store it.
            // If we had to convert the array to do the store, we'll bail.
            LoadScriptContext(stElem);

            m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

            IR::IntConstOpnd * intConstIndexOpnd = IR::IntConstOpnd::New(value, TyUint32, m_func);

            m_lowererMD.LoadHelperArgument(stElem, intConstIndexOpnd);
            m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

            IR::JnHelperMethod helperMethod;
            if (baseValueType.HasIntElements())
            {
                helperMethod = IR::HelperScrArr_SetNativeIntElementC;
            }
            else
            {
                helperMethod = IR::HelperScrArr_SetNativeFloatElementC;
            }

            IR::Instr *instrInsertBranch = stElem->m_next;
            IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyUint32, m_func);
            stElem->ReplaceDst(typeIdOpnd);
            m_lowererMD.ChangeToHelperCall(stElem, helperMethod);

            InsertCompareBranch(
                typeIdOpnd,
                IR::IntConstOpnd::New(
                    baseValueType.HasIntElements() ?
                    Js::TypeIds_NativeIntArray : Js::TypeIds_NativeFloatArray, TyUint32, m_func),
                Js::OpCode::BrNeq_A,
                labelBailOut,
                instrInsertBranch);

            return instrPrev;
        }
        else if (baseValueType.HasIntElements() && labelBailOut)
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
            IR::Opnd* missingElementOpnd = GetMissingItemOpnd(stElem->GetSrc1()->GetType(), m_func);
            if (!stElem->GetSrc1()->IsEqual(missingElementOpnd))
            {
                InsertMissingItemCompareBranch(stElem->GetSrc1(), Js::OpCode::BrEq_A, labelBailOut, stElem);
            }
            else
            {
                //Its a missing value store and data flow proves that src1 is always missing value. Array cannot be an int array at the first place
                //if this code was ever hit. Just bailout, this code path would be updated with the profile information next time around.
                InsertBranch(Js::OpCode::Br, labelBailOut, stElem);
#if DBG
                labelBailOut->m_noHelperAssert = true;
#endif
                stElem->Remove();
                return instrPrev;
            }
        }
        else
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
        }
        stElem->GetDst()->SetType(stElem->GetSrc1()->GetType());
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);

        if(baseValueType.HasIntElements())
        {
            base = sizeof(Js::JavascriptNativeIntArray) + offsetof(Js::SparseArraySegment<int32>, elements);
        }
        else
        {
            base = sizeof(Js::JavascriptNativeFloatArray) + offsetof(Js::SparseArraySegment<double>, elements);
        }
    }
    else if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::Array)
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);
        base = sizeof(Js::JavascriptArray) + offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    else
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC);
        Assert(indirOpnd->GetBaseOpnd()->GetType() == TyVar);
        base = offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    Assert(value >= 0);

    //  MOV [r3 + offset(element) + index], src
    const BYTE indirScale =
        baseValueType.IsLikelyAnyOptimizedArray() ? GetArrayIndirScale(baseValueType) : m_lowererMD.GetDefaultIndirScale();
    IntConstType offset = base + (value << indirScale);
    Assert(Math::FitsInDWord(offset));
    indirOpnd->SetOffset((int32)offset);
    m_lowererMD.ChangeToWriteBarrierAssign(stElem, this->m_func);

    return instrPrev;
}